

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  short *psVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined1 auVar27 [16];
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  parasail_result_t *ppVar33;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  size_t len;
  long lVar34;
  uint uVar35;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  int16_t iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  undefined2 uVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  undefined4 uVar52;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined4 uVar53;
  uint uVar54;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ulong uVar65;
  ushort uVar69;
  ulong uVar70;
  ushort uVar75;
  ushort uVar76;
  ushort uVar78;
  ushort uVar80;
  ushort uVar81;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ushort uVar77;
  ushort uVar82;
  undefined1 auVar74 [16];
  ulong uVar79;
  short sVar83;
  short sVar89;
  ulong uVar84;
  short sVar87;
  short sVar88;
  short sVar90;
  short sVar93;
  short sVar94;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar95;
  ulong uVar91;
  ulong uVar92;
  ushort uVar96;
  ulong uVar97;
  ushort uVar101;
  ushort uVar102;
  ushort uVar104;
  ushort uVar106;
  ushort uVar107;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  ushort uVar103;
  ushort uVar108;
  undefined1 auVar100 [16];
  ulong uVar105;
  undefined1 in_XMM4 [16];
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar136 [16];
  ushort uVar137;
  ushort uVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar141;
  ushort uVar142;
  ushort uVar143;
  ushort uVar144;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_16_t h;
  undefined1 local_208 [16];
  long local_198;
  ulong uStack_190;
  ushort local_138;
  ushort uStack_136;
  int local_118;
  undefined4 uStack_114;
  uint uStack_110;
  undefined4 uStack_10c;
  ushort local_98;
  ushort uStack_96;
  longlong local_48;
  longlong lStack_40;
  short sVar51;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar66;
  short sVar67;
  short sVar68;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_6();
      }
      else {
        uVar31 = profile->s1Len;
        if ((int)uVar31 < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse2_128_16_cold_1();
        }
        else {
          local_208._0_4_ = gap;
          iVar37 = uVar31 - 1;
          uVar50 = (ulong)uVar31 + 7 >> 3;
          uVar49 = (uint)uVar50;
          iVar28 = iVar37 / (int)uVar49;
          uVar38 = iVar37 % (int)uVar49;
          iVar40 = -open;
          iVar41 = ppVar7->min;
          iVar44 = -iVar41;
          if (iVar41 != iVar40 && SBORROW4(iVar41,iVar40) == iVar41 + open < 0) {
            iVar44 = open;
          }
          pvVar8 = (profile->profile16).matches;
          iVar41 = ppVar7->max;
          pvVar9 = (profile->profile16).similar;
          ppVar33 = parasail_result_new_rowcol3((uint)((ulong)uVar31 + 7) & 0x7ffffff8,s2Len);
          if (ppVar33 != (parasail_result_t *)0x0) {
            ppVar33->flag = ppVar33->flag | 0x8250401;
            b = parasail_memalign___m128i(0x10,uVar50);
            b_00 = parasail_memalign___m128i(0x10,uVar50);
            b_01 = parasail_memalign___m128i(0x10,uVar50);
            b_02 = parasail_memalign___m128i(0x10,uVar50);
            ptr = parasail_memalign___m128i(0x10,uVar50);
            b_03 = parasail_memalign___m128i(0x10,uVar50);
            b_04 = parasail_memalign___m128i(0x10,uVar50);
            b_05 = parasail_memalign___m128i(0x10,uVar50);
            ptr_00 = parasail_memalign___m128i(0x10,uVar50);
            ptr_01 = parasail_memalign___m128i(0x10,uVar50);
            ptr_02 = parasail_memalign___m128i(0x10,uVar50);
            ptr_03 = parasail_memalign___m128i(0x10,uVar50);
            ptr_04 = parasail_memalign___m128i(0x10,uVar50);
            ptr_05 = parasail_memalign___m128i(0x10,uVar50);
            ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_06 != (int16_t *)0x0 &&
                (ptr_05 != (__m128i *)0x0 && (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))
                ) && ((ptr_02 != (__m128i *)0x0 &&
                      (ptr_01 != (__m128i *)0x0 &&
                      (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0))) &&
                     ((b_04 != (__m128i *)0x0 && (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0))
                     && ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                        (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
              iVar29 = s2Len + -1;
              iVar30 = 7 - iVar28;
              auVar56 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar52 = auVar56._0_4_;
              len = (size_t)(uint)gap;
              auVar56 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar53 = auVar56._0_4_;
              uVar31 = iVar44 - 0x7fff;
              auVar57 = pshuflw(ZEXT416(uVar31),ZEXT416(uVar31),0);
              local_138 = auVar57._0_2_;
              uStack_136 = auVar57._2_2_;
              auVar56 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar8 >> 0x10),0x7ffe - (short)iVar41)
                               );
              auVar58 = pshuflw(auVar56,auVar56,0);
              auVar56 = pshuflw(ZEXT416(uVar49),ZEXT416(uVar49),0);
              uVar54 = auVar56._0_4_;
              auVar56 = ZEXT416(-(uVar49 * gap));
              auVar56 = pshuflw(auVar56,auVar56,0);
              uVar32 = auVar56._0_4_;
              auVar117._0_8_ = CONCAT44(uVar32,uVar32);
              auVar117._8_4_ = uVar32;
              auVar117._12_4_ = uVar32;
              auVar71._0_8_ = auVar117._0_8_ << 0x10;
              auVar71._8_8_ = auVar117._8_8_ << 0x10 | (ulong)(uVar32 >> 0x10);
              auVar59 = paddsw(auVar71,ZEXT416(uVar31 & 0xffff));
              c[1] = uVar50;
              c[0] = uVar50;
              parasail_memset___m128i(b_03,c,len);
              c_00[1] = extraout_RDX;
              c_00[0] = uVar50;
              parasail_memset___m128i(b_04,c_00,len);
              c_01[1] = extraout_RDX_00;
              c_01[0] = uVar50;
              parasail_memset___m128i(b_05,c_01,len);
              c_02[1] = extraout_RDX_01;
              c_02[0] = uVar50;
              parasail_memset___m128i(b,c_02,len);
              c_03[1] = extraout_RDX_02;
              c_03[0] = uVar50;
              parasail_memset___m128i(b_00,c_03,len);
              c_04[1] = extraout_RDX_03;
              c_04[0] = uVar50;
              parasail_memset___m128i(b_01,c_04,len);
              c_05[1] = extraout_RDX_04;
              c_05[0] = uVar50;
              parasail_memset___m128i(b_02,c_05,len);
              auVar117 = _DAT_008d0b80;
              auVar56._4_4_ = uVar53;
              auVar56._0_4_ = uVar53;
              auVar56._8_4_ = uVar53;
              auVar56._12_4_ = uVar53;
              auVar72._4_4_ = uVar52;
              auVar72._0_4_ = uVar52;
              auVar72._8_4_ = uVar52;
              auVar72._12_4_ = uVar52;
              auVar98 = psubsw((undefined1  [16])0x0,auVar72);
              uVar32 = uVar49 - 1;
              lVar34 = (ulong)uVar32 << 4;
              uVar36 = uVar50;
              auVar71 = _DAT_008d0b80;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar34) = auVar98;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar34) = auVar71;
                auVar98 = psubsw(auVar98,auVar56);
                auVar71 = paddsw(auVar71,auVar117);
                lVar34 = lVar34 + -0x10;
                iVar41 = (int)uVar36;
                uVar35 = iVar41 - 1;
                uVar36 = (ulong)uVar35;
              } while (uVar35 != 0 && 0 < iVar41);
              uVar36 = 0;
              iVar41 = iVar40;
              do {
                lVar34 = 0;
                iVar44 = iVar41;
                do {
                  uVar45 = 0x8000;
                  if (-0x8000 < iVar44) {
                    uVar45 = (undefined2)iVar44;
                  }
                  *(undefined2 *)((long)&local_48 + lVar34 * 2) = uVar45;
                  lVar34 = lVar34 + 1;
                  iVar44 = iVar44 - uVar49 * gap;
                } while (lVar34 != 8);
                ptr[uVar36][0] = local_48;
                ptr[uVar36][1] = lStack_40;
                uVar36 = uVar36 + 1;
                iVar41 = iVar41 - gap;
              } while (uVar36 != uVar50);
              *ptr_06 = 0;
              uVar36 = 1;
              do {
                iVar39 = -0x8000;
                if (-0x8000 < iVar40) {
                  iVar39 = (int16_t)iVar40;
                }
                ptr_06[uVar36] = iVar39;
                uVar36 = uVar36 + 1;
                iVar40 = iVar40 - gap;
              } while (s2Len + 1 != uVar36);
              local_118 = uVar54 << 0x10;
              uStack_110 = uVar54 << 0x10 | uVar54 >> 0x10;
              uStack_114 = (undefined4)(CONCAT44(uVar54,uVar54) >> 0x10);
              uStack_10c = (undefined4)(CONCAT44(uVar54,uVar54) >> 0x10);
              iVar41 = 1;
              if (1 < iVar30) {
                iVar41 = iVar30;
              }
              uVar36 = 1;
              if (1 < s2Len) {
                uVar36 = (ulong)(uint)s2Len;
              }
              lVar34 = (ulong)(uVar49 + (uVar49 == 0)) << 4;
              local_98 = auVar58._0_2_;
              uStack_96 = auVar58._2_2_;
              uVar46 = 0;
              uVar109 = local_138;
              uVar110 = uStack_136;
              uVar111 = local_138;
              uVar112 = uStack_136;
              uVar113 = local_138;
              uVar114 = uStack_136;
              uVar115 = local_138;
              uVar116 = uStack_136;
              uVar137 = local_98;
              uVar138 = uStack_96;
              uVar139 = local_98;
              uVar140 = uStack_96;
              uVar141 = local_98;
              uVar142 = uStack_96;
              uVar143 = local_98;
              uVar144 = uStack_96;
              do {
                uVar92 = ptr[uVar32][0];
                uVar97 = b_03[uVar32][0];
                uVar105 = b_04[uVar32][0];
                uVar84 = b_05[uVar32][0];
                auVar129._0_8_ = uVar97 << 0x10;
                auVar129._8_8_ = b_03[uVar32][1] << 0x10 | uVar97 >> 0x30;
                auVar121._0_8_ = uVar105 << 0x10;
                auVar121._8_8_ = b_04[uVar32][1] << 0x10 | uVar105 >> 0x30;
                local_198 = uVar84 << 0x10;
                uStack_190 = b_05[uVar32][1] << 0x10 | uVar84 >> 0x30;
                auVar98._8_8_ = ptr[uVar32][1] << 0x10 | uVar92 >> 0x30;
                auVar98._0_8_ = uVar92 << 0x10 | (ulong)(ushort)ptr_06[uVar46];
                lVar47 = uVar50 * (long)ppVar7->mapper[(byte)s2[uVar46]] * 0x10;
                auVar58._4_2_ = local_138;
                auVar58._0_4_ = auVar57._0_4_;
                auVar58._6_2_ = uStack_136;
                auVar58._8_2_ = local_138;
                auVar58._10_2_ = uStack_136;
                auVar58._12_2_ = local_138;
                auVar58._14_2_ = uStack_136;
                auVar120 = psubsw(auVar58,(undefined1  [16])*ptr_04);
                auVar56 = (undefined1  [16])0x0;
                lVar42 = 0;
                auVar117 = (undefined1  [16])0x0;
                auVar71 = (undefined1  [16])0x0;
                do {
                  auVar4 = *(undefined1 (*) [16])((long)*ptr + lVar42);
                  auVar72 = psubsw(auVar4,auVar72);
                  auVar99._4_4_ = uVar53;
                  auVar99._0_4_ = uVar53;
                  auVar99._8_4_ = uVar53;
                  auVar99._12_4_ = uVar53;
                  auVar99 = psubsw(*(undefined1 (*) [16])((long)*b + lVar42),auVar99);
                  sVar51 = auVar72._0_2_;
                  sVar83 = auVar99._0_2_;
                  auVar60._0_2_ = -(ushort)(sVar83 < sVar51);
                  sVar61 = auVar72._2_2_;
                  sVar87 = auVar99._2_2_;
                  auVar60._2_2_ = -(ushort)(sVar87 < sVar61);
                  sVar62 = auVar72._4_2_;
                  sVar88 = auVar99._4_2_;
                  auVar60._4_2_ = -(ushort)(sVar88 < sVar62);
                  sVar63 = auVar72._6_2_;
                  sVar89 = auVar99._6_2_;
                  auVar60._6_2_ = -(ushort)(sVar89 < sVar63);
                  sVar64 = auVar72._8_2_;
                  sVar90 = auVar99._8_2_;
                  auVar60._8_2_ = -(ushort)(sVar90 < sVar64);
                  sVar66 = auVar72._10_2_;
                  sVar93 = auVar99._10_2_;
                  auVar60._10_2_ = -(ushort)(sVar93 < sVar66);
                  sVar67 = auVar72._12_2_;
                  sVar94 = auVar99._12_2_;
                  sVar68 = auVar72._14_2_;
                  auVar60._12_2_ = -(ushort)(sVar94 < sVar67);
                  sVar95 = auVar99._14_2_;
                  auVar60._14_2_ = -(ushort)(sVar95 < sVar68);
                  uVar96 = (ushort)(sVar83 < sVar51) * sVar51 | (ushort)(sVar83 >= sVar51) * sVar83;
                  uVar101 = (ushort)(sVar87 < sVar61) * sVar61 | (ushort)(sVar87 >= sVar61) * sVar87
                  ;
                  uVar102 = (ushort)(sVar88 < sVar62) * sVar62 | (ushort)(sVar88 >= sVar62) * sVar88
                  ;
                  uVar103 = (ushort)(sVar89 < sVar63) * sVar63 | (ushort)(sVar89 >= sVar63) * sVar89
                  ;
                  uVar104 = (ushort)(sVar90 < sVar64) * sVar64 | (ushort)(sVar90 >= sVar64) * sVar90
                  ;
                  uVar106 = (ushort)(sVar93 < sVar66) * sVar66 | (ushort)(sVar93 >= sVar66) * sVar93
                  ;
                  uVar107 = (ushort)(sVar94 < sVar67) * sVar67 | (ushort)(sVar94 >= sVar67) * sVar94
                  ;
                  uVar108 = (ushort)(sVar95 < sVar68) * sVar68 | (ushort)(sVar95 >= sVar68) * sVar95
                  ;
                  auVar99 = *(undefined1 (*) [16])((long)*b_03 + lVar42);
                  auVar125 = auVar99 & auVar60 |
                             ~auVar60 & *(undefined1 (*) [16])((long)*b_00 + lVar42);
                  auVar130 = *(undefined1 (*) [16])((long)*b_04 + lVar42);
                  auVar73 = auVar130 & auVar60 |
                            ~auVar60 & *(undefined1 (*) [16])((long)*b_01 + lVar42);
                  auVar122 = *(undefined1 (*) [16])((long)*b_05 + lVar42);
                  auVar5 = *(undefined1 (*) [16])((long)*b_02 + lVar42);
                  auVar72 = paddsw(auVar120,*(undefined1 (*) [16])((long)*ptr_04 + lVar42));
                  sVar51 = auVar58._0_2_;
                  sVar83 = auVar72._0_2_;
                  auVar128._0_2_ = -(ushort)(sVar51 < sVar83);
                  sVar61 = auVar58._2_2_;
                  sVar87 = auVar72._2_2_;
                  auVar128._2_2_ = -(ushort)(sVar61 < sVar87);
                  sVar62 = auVar58._4_2_;
                  sVar88 = auVar72._4_2_;
                  auVar128._4_2_ = -(ushort)(sVar62 < sVar88);
                  sVar63 = auVar58._6_2_;
                  sVar89 = auVar72._6_2_;
                  auVar128._6_2_ = -(ushort)(sVar63 < sVar89);
                  sVar64 = auVar58._8_2_;
                  sVar90 = auVar72._8_2_;
                  auVar128._8_2_ = -(ushort)(sVar64 < sVar90);
                  sVar66 = auVar58._10_2_;
                  sVar93 = auVar72._10_2_;
                  auVar128._10_2_ = -(ushort)(sVar66 < sVar93);
                  sVar67 = auVar58._12_2_;
                  sVar94 = auVar72._12_2_;
                  sVar95 = auVar72._14_2_;
                  auVar128._12_2_ = -(ushort)(sVar67 < sVar94);
                  sVar68 = auVar58._14_2_;
                  auVar128._14_2_ = -(ushort)(sVar68 < sVar95);
                  auVar58._0_2_ =
                       (ushort)(sVar83 < sVar51) * sVar51 | (ushort)(sVar83 >= sVar51) * sVar83;
                  auVar58._2_2_ =
                       (ushort)(sVar87 < sVar61) * sVar61 | (ushort)(sVar87 >= sVar61) * sVar87;
                  auVar58._4_2_ =
                       (ushort)(sVar88 < sVar62) * sVar62 | (ushort)(sVar88 >= sVar62) * sVar88;
                  auVar58._6_2_ =
                       (ushort)(sVar89 < sVar63) * sVar63 | (ushort)(sVar89 >= sVar63) * sVar89;
                  auVar58._8_2_ =
                       (ushort)(sVar90 < sVar64) * sVar64 | (ushort)(sVar90 >= sVar64) * sVar90;
                  auVar58._10_2_ =
                       (ushort)(sVar93 < sVar66) * sVar66 | (ushort)(sVar93 >= sVar66) * sVar93;
                  auVar58._12_2_ =
                       (ushort)(sVar94 < sVar67) * sVar67 | (ushort)(sVar94 >= sVar67) * sVar94;
                  auVar58._14_2_ =
                       (ushort)(sVar95 < sVar68) * sVar68 | (ushort)(sVar95 >= sVar68) * sVar95;
                  auVar71 = local_208 & auVar128 | ~auVar128 & auVar71;
                  auVar117 = in_XMM4 & auVar128 | ~auVar128 & auVar117;
                  auVar72 = paddsw(in_XMM13,*(undefined1 (*) [16])((long)*ptr_05 + lVar42));
                  auVar56 = ~auVar128 & auVar56 | auVar72 & auVar128;
                  auVar128 = paddsw(auVar98,*(undefined1 (*) [16])((long)pvVar6 + lVar42 + lVar47));
                  auVar134 = paddsw(auVar129,*(undefined1 (*) [16])((long)pvVar8 + lVar42 + lVar47))
                  ;
                  auVar129 = paddsw(auVar121,*(undefined1 (*) [16])((long)pvVar9 + lVar42 + lVar47))
                  ;
                  sVar51 = auVar128._0_2_;
                  auVar136._0_2_ = -(ushort)(sVar51 < (short)uVar96);
                  sVar61 = auVar128._2_2_;
                  auVar136._2_2_ = -(ushort)(sVar61 < (short)uVar101);
                  sVar62 = auVar128._4_2_;
                  auVar136._4_2_ = -(ushort)(sVar62 < (short)uVar102);
                  sVar63 = auVar128._6_2_;
                  auVar136._6_2_ = -(ushort)(sVar63 < (short)uVar103);
                  sVar64 = auVar128._8_2_;
                  auVar136._8_2_ = -(ushort)(sVar64 < (short)uVar104);
                  sVar66 = auVar128._10_2_;
                  auVar136._10_2_ = -(ushort)(sVar66 < (short)uVar106);
                  sVar67 = auVar128._12_2_;
                  auVar136._12_2_ = -(ushort)(sVar67 < (short)uVar107);
                  sVar68 = auVar128._14_2_;
                  auVar136._14_2_ = -(ushort)(sVar68 < (short)uVar108);
                  puVar1 = (ushort *)((long)*b + lVar42);
                  *puVar1 = uVar96;
                  puVar1[1] = uVar101;
                  puVar1[2] = uVar102;
                  puVar1[3] = uVar103;
                  puVar1[4] = uVar104;
                  puVar1[5] = uVar106;
                  puVar1[6] = uVar107;
                  puVar1[7] = uVar108;
                  *(undefined1 (*) [16])((long)*b_00 + lVar42) = auVar125;
                  local_208 = ~auVar136 & auVar134 | auVar125 & auVar136;
                  *(undefined1 (*) [16])((long)*b_01 + lVar42) = auVar73;
                  in_XMM4 = ~auVar136 & auVar129 | auVar73 & auVar136;
                  auVar98 = paddsw(~auVar60 & auVar5 | auVar122 & auVar60,_DAT_008d0b80);
                  auVar5._8_8_ = uStack_190;
                  auVar5._0_8_ = local_198;
                  auVar121 = paddsw(auVar5,_DAT_008d0b80);
                  *(undefined1 (*) [16])((long)*b_02 + lVar42) = auVar98;
                  in_XMM13 = ~auVar136 & auVar121 | auVar98 & auVar136;
                  uVar96 = (ushort)((short)uVar96 < sVar51) * sVar51 |
                           ((short)uVar96 >= sVar51) * uVar96;
                  uVar101 = (ushort)((short)uVar101 < sVar61) * sVar61 |
                            ((short)uVar101 >= sVar61) * uVar101;
                  uVar102 = (ushort)((short)uVar102 < sVar62) * sVar62 |
                            ((short)uVar102 >= sVar62) * uVar102;
                  uVar103 = (ushort)((short)uVar103 < sVar63) * sVar63 |
                            ((short)uVar103 >= sVar63) * uVar103;
                  auVar120._0_8_ = CONCAT26(uVar103,CONCAT24(uVar102,CONCAT22(uVar101,uVar96)));
                  auVar120._8_2_ =
                       (ushort)((short)uVar104 < sVar64) * sVar64 |
                       ((short)uVar104 >= sVar64) * uVar104;
                  auVar120._10_2_ =
                       (ushort)((short)uVar106 < sVar66) * sVar66 |
                       ((short)uVar106 >= sVar66) * uVar106;
                  auVar120._12_2_ =
                       (ushort)((short)uVar107 < sVar67) * sVar67 |
                       ((short)uVar107 >= sVar67) * uVar107;
                  auVar120._14_2_ =
                       (ushort)((short)uVar108 < sVar68) * sVar68 |
                       ((short)uVar108 >= sVar68) * uVar108;
                  *(undefined1 (*) [16])((long)*ptr + lVar42) = auVar128;
                  *(undefined1 (*) [16])((long)*b_03 + lVar42) = auVar134;
                  *(undefined1 (*) [16])((long)*b_04 + lVar42) = auVar129;
                  *(undefined1 (*) [16])((long)*b_05 + lVar42) = auVar121;
                  lVar42 = lVar42 + 0x10;
                  local_198 = auVar122._0_8_;
                  uStack_190 = auVar122._8_8_;
                  auVar98 = auVar4;
                  auVar121 = auVar130;
                  auVar129 = auVar99;
                } while (lVar34 != lVar42);
                lVar42 = local_208._8_8_;
                uVar92 = local_208._0_8_;
                local_208._0_8_ = uVar92 << 0x10;
                local_208._8_8_ = lVar42 << 0x10 | uVar92 >> 0x30;
                lVar42 = in_XMM4._8_8_;
                uVar92 = in_XMM4._0_8_;
                in_XMM4._0_8_ = uVar92 << 0x10;
                in_XMM4._8_8_ = lVar42 << 0x10 | uVar92 >> 0x30;
                lVar42 = in_XMM13._8_8_;
                uVar92 = in_XMM13._0_8_;
                in_XMM13._0_8_ = uVar92 << 0x10;
                in_XMM13._8_8_ = lVar42 << 0x10 | uVar92 >> 0x30;
                auVar122._8_8_ = auVar120._8_8_ << 0x10 | (ulong)uVar103;
                uVar104 = ptr_06[uVar46 + 1];
                auVar122._0_8_ = auVar120._0_8_ << 0x10 | (ulong)uVar104;
                uVar92 = uVar46 + 1;
                auVar98 = paddsw((undefined1  [16])*ptr_04,auVar122);
                sVar51 = auVar98._0_2_;
                auVar73._0_2_ = -(ushort)(sVar51 < (short)auVar58._0_2_);
                sVar61 = auVar98._2_2_;
                auVar73._2_2_ = -(ushort)(sVar61 < (short)auVar58._2_2_);
                sVar62 = auVar98._4_2_;
                auVar73._4_2_ = -(ushort)(sVar62 < (short)auVar58._4_2_);
                sVar63 = auVar98._6_2_;
                auVar73._6_2_ = -(ushort)(sVar63 < (short)auVar58._6_2_);
                sVar64 = auVar98._8_2_;
                auVar73._8_2_ = -(ushort)(sVar64 < (short)auVar58._8_2_);
                sVar66 = auVar98._10_2_;
                auVar73._10_2_ = -(ushort)(sVar66 < (short)auVar58._10_2_);
                sVar67 = auVar98._12_2_;
                auVar73._12_2_ = -(ushort)(sVar67 < (short)auVar58._12_2_);
                sVar68 = auVar98._14_2_;
                auVar73._14_2_ = -(ushort)(sVar68 < (short)auVar58._14_2_);
                auVar130._0_2_ =
                     (sVar51 < (short)auVar58._0_2_) * auVar58._0_2_ |
                     (ushort)(sVar51 >= (short)auVar58._0_2_) * sVar51;
                auVar130._2_2_ =
                     (sVar61 < (short)auVar58._2_2_) * auVar58._2_2_ |
                     (ushort)(sVar61 >= (short)auVar58._2_2_) * sVar61;
                auVar130._4_2_ =
                     (sVar62 < (short)auVar58._4_2_) * auVar58._4_2_ |
                     (ushort)(sVar62 >= (short)auVar58._4_2_) * sVar62;
                auVar130._6_2_ =
                     (sVar63 < (short)auVar58._6_2_) * auVar58._6_2_ |
                     (ushort)(sVar63 >= (short)auVar58._6_2_) * sVar63;
                auVar130._8_2_ =
                     (sVar64 < (short)auVar58._8_2_) * auVar58._8_2_ |
                     (ushort)(sVar64 >= (short)auVar58._8_2_) * sVar64;
                auVar130._10_2_ =
                     (sVar66 < (short)auVar58._10_2_) * auVar58._10_2_ |
                     (ushort)(sVar66 >= (short)auVar58._10_2_) * sVar66;
                auVar130._12_2_ =
                     (sVar67 < (short)auVar58._12_2_) * auVar58._12_2_ |
                     (ushort)(sVar67 >= (short)auVar58._12_2_) * sVar67;
                auVar130._14_2_ =
                     (sVar68 < (short)auVar58._14_2_) * auVar58._14_2_ |
                     (ushort)(sVar68 >= (short)auVar58._14_2_) * sVar68;
                auVar58 = auVar71 & auVar73 | ~auVar73 & local_208;
                auVar71 = auVar117 & auVar73 | ~auVar73 & in_XMM4;
                auVar117 = paddsw((undefined1  [16])*ptr_05,in_XMM13);
                auVar56 = ~auVar73 & auVar117 | auVar56 & auVar73;
                iVar44 = 6;
                auVar4._4_4_ = uStack_114;
                auVar4._0_4_ = local_118;
                auVar4._8_4_ = uStack_110;
                auVar4._12_4_ = uStack_10c;
                do {
                  auVar126._0_8_ = auVar56._0_8_ << 0x10;
                  auVar126._8_8_ = auVar56._8_8_ << 0x10 | auVar56._0_8_ >> 0x30;
                  auVar98 = paddsw(auVar126,auVar4);
                  auVar134._0_8_ = auVar130._0_8_ << 0x10;
                  auVar134._8_8_ = auVar130._8_8_ << 0x10 | auVar130._0_8_ >> 0x30;
                  auVar117 = paddsw(auVar134,auVar59);
                  sVar51 = auVar117._0_2_;
                  sVar83 = auVar130._0_2_;
                  sVar61 = auVar117._2_2_;
                  sVar87 = auVar130._2_2_;
                  sVar62 = auVar117._4_2_;
                  sVar88 = auVar130._4_2_;
                  sVar63 = auVar117._6_2_;
                  sVar89 = auVar130._6_2_;
                  uVar106 = (ushort)(sVar89 < sVar63) * sVar63 | (ushort)(sVar89 >= sVar63) * sVar89
                  ;
                  auVar131._0_8_ =
                       CONCAT26(uVar106,CONCAT24((ushort)(sVar88 < sVar62) * sVar62 |
                                                 (ushort)(sVar88 >= sVar62) * sVar88,
                                                 CONCAT22((ushort)(sVar87 < sVar61) * sVar61 |
                                                          (ushort)(sVar87 >= sVar61) * sVar87,
                                                          (ushort)(sVar83 < sVar51) * sVar51 |
                                                          (ushort)(sVar83 >= sVar51) * sVar83)));
                  sVar64 = auVar117._8_2_;
                  sVar90 = auVar130._8_2_;
                  auVar131._8_2_ =
                       (ushort)(sVar90 < sVar64) * sVar64 | (ushort)(sVar90 >= sVar64) * sVar90;
                  sVar66 = auVar117._10_2_;
                  sVar93 = auVar130._10_2_;
                  auVar131._10_2_ =
                       (ushort)(sVar93 < sVar66) * sVar66 | (ushort)(sVar93 >= sVar66) * sVar93;
                  sVar67 = auVar117._12_2_;
                  sVar94 = auVar130._12_2_;
                  sVar95 = auVar130._14_2_;
                  auVar131._12_2_ =
                       (ushort)(sVar94 < sVar67) * sVar67 | (ushort)(sVar94 >= sVar67) * sVar94;
                  sVar68 = auVar117._14_2_;
                  auVar131._14_2_ =
                       (ushort)(sVar95 < sVar68) * sVar68 | (ushort)(sVar95 >= sVar68) * sVar95;
                  auVar125._0_2_ = -(ushort)(sVar51 < sVar83);
                  auVar125._2_2_ = -(ushort)(sVar61 < sVar87);
                  auVar125._4_2_ = -(ushort)(sVar62 < sVar88);
                  auVar125._6_2_ = -(ushort)(sVar63 < sVar89);
                  auVar125._8_2_ = -(ushort)(sVar64 < sVar90);
                  auVar125._10_2_ = -(ushort)(sVar66 < sVar93);
                  auVar125._12_2_ = -(ushort)(sVar67 < sVar94);
                  auVar125._14_2_ = -(ushort)(sVar68 < sVar95);
                  auVar85._0_8_ = auVar58._0_8_ << 0x10;
                  auVar85._8_8_ = auVar58._8_8_ << 0x10 | auVar58._0_8_ >> 0x30;
                  auVar58 = auVar58 & auVar125 | ~auVar125 & auVar85;
                  auVar86._0_8_ = auVar71._0_8_ << 0x10;
                  auVar86._8_8_ = auVar71._8_8_ << 0x10 | auVar71._0_8_ >> 0x30;
                  auVar71 = auVar71 & auVar125 | ~auVar125 & auVar86;
                  auVar56 = ~auVar125 & auVar98 | auVar56 & auVar125;
                  iVar44 = iVar44 + -1;
                  auVar130 = auVar131;
                } while (iVar44 != 0);
                auVar119._0_8_ = auVar58._0_8_ << 0x10;
                auVar119._8_8_ = auVar58._8_8_ << 0x10 | auVar58._0_8_ >> 0x30;
                auVar118._0_8_ = auVar71._0_8_ << 0x10;
                auVar118._8_8_ = auVar71._8_8_ << 0x10 | auVar71._0_8_ >> 0x30;
                auVar127._0_8_ = auVar56._0_8_ << 0x10;
                auVar127._8_8_ = auVar56._8_8_ << 0x10 | auVar56._0_8_ >> 0x30;
                auVar132._0_8_ = auVar131._0_8_ << 0x10;
                auVar132._8_8_ = auVar131._8_8_ << 0x10 | (ulong)uVar106;
                auVar133 = paddsw(auVar132,ZEXT416(uVar31 & 0xffff));
                sVar51 = auVar133._0_2_;
                auVar135._0_2_ = -(ushort)((short)uVar104 < sVar51);
                sVar61 = auVar133._2_2_;
                auVar135._2_2_ = -(ushort)((short)uVar96 < sVar61);
                sVar62 = auVar133._4_2_;
                auVar135._4_2_ = -(ushort)((short)uVar101 < sVar62);
                sVar63 = auVar133._6_2_;
                auVar135._6_2_ = -(ushort)((short)uVar102 < sVar63);
                sVar64 = auVar133._8_2_;
                auVar135._8_2_ = -(ushort)((short)uVar103 < sVar64);
                sVar66 = auVar133._10_2_;
                auVar135._10_2_ = -(ushort)((short)auVar120._8_2_ < sVar66);
                sVar67 = auVar133._12_2_;
                sVar68 = auVar133._14_2_;
                auVar135._12_2_ = -(ushort)((short)auVar120._10_2_ < sVar67);
                auVar135._14_2_ = -(ushort)((short)auVar120._12_2_ < sVar68);
                auVar123._0_2_ =
                     (ushort)((short)uVar104 < sVar51) * sVar51 |
                     ((short)uVar104 >= sVar51) * uVar104;
                auVar123._2_2_ =
                     (ushort)((short)uVar96 < sVar61) * sVar61 | ((short)uVar96 >= sVar61) * uVar96;
                auVar123._4_2_ =
                     (ushort)((short)uVar101 < sVar62) * sVar62 |
                     ((short)uVar101 >= sVar62) * uVar101;
                auVar123._6_2_ =
                     (ushort)((short)uVar102 < sVar63) * sVar63 |
                     ((short)uVar102 >= sVar63) * uVar102;
                auVar123._8_2_ =
                     (ushort)((short)uVar103 < sVar64) * sVar64 |
                     ((short)uVar103 >= sVar64) * uVar103;
                auVar123._10_2_ =
                     (ushort)((short)auVar120._8_2_ < sVar66) * sVar66 |
                     ((short)auVar120._8_2_ >= sVar66) * auVar120._8_2_;
                auVar123._12_2_ =
                     (ushort)((short)auVar120._10_2_ < sVar67) * sVar67 |
                     ((short)auVar120._10_2_ >= sVar67) * auVar120._10_2_;
                auVar123._14_2_ =
                     (ushort)((short)auVar120._12_2_ < sVar68) * sVar68 |
                     ((short)auVar120._12_2_ >= sVar68) * auVar120._12_2_;
                auVar71 = auVar119 & auVar135 | ~auVar135 & local_208;
                auVar56 = auVar118 & auVar135 | ~auVar135 & in_XMM4;
                auVar117 = ~auVar135 & in_XMM13 | auVar127 & auVar135;
                lVar42 = 0;
                do {
                  puVar1 = (ushort *)((long)*ptr + lVar42);
                  uVar96 = *puVar1;
                  uVar101 = puVar1[1];
                  uVar102 = puVar1[2];
                  uVar103 = puVar1[3];
                  uVar104 = puVar1[4];
                  uVar106 = puVar1[5];
                  uVar107 = puVar1[6];
                  uVar108 = puVar1[7];
                  auVar58 = psubsw(auVar123,auVar72);
                  auVar27._4_4_ = uVar53;
                  auVar27._0_4_ = uVar53;
                  auVar27._8_4_ = uVar53;
                  auVar27._12_4_ = uVar53;
                  auVar98 = psubsw(auVar133,auVar27);
                  sVar51 = auVar98._0_2_;
                  sVar83 = auVar58._0_2_;
                  auVar133._0_2_ =
                       (ushort)(sVar83 < sVar51) * sVar51 | (ushort)(sVar83 >= sVar51) * sVar83;
                  sVar61 = auVar98._2_2_;
                  sVar87 = auVar58._2_2_;
                  auVar133._2_2_ =
                       (ushort)(sVar87 < sVar61) * sVar61 | (ushort)(sVar87 >= sVar61) * sVar87;
                  sVar62 = auVar98._4_2_;
                  sVar88 = auVar58._4_2_;
                  auVar133._4_2_ =
                       (ushort)(sVar88 < sVar62) * sVar62 | (ushort)(sVar88 >= sVar62) * sVar88;
                  sVar63 = auVar98._6_2_;
                  sVar89 = auVar58._6_2_;
                  auVar133._6_2_ =
                       (ushort)(sVar89 < sVar63) * sVar63 | (ushort)(sVar89 >= sVar63) * sVar89;
                  sVar64 = auVar98._8_2_;
                  sVar90 = auVar58._8_2_;
                  auVar133._8_2_ =
                       (ushort)(sVar90 < sVar64) * sVar64 | (ushort)(sVar90 >= sVar64) * sVar90;
                  sVar66 = auVar98._10_2_;
                  sVar93 = auVar58._10_2_;
                  auVar133._10_2_ =
                       (ushort)(sVar93 < sVar66) * sVar66 | (ushort)(sVar93 >= sVar66) * sVar93;
                  sVar67 = auVar98._12_2_;
                  sVar94 = auVar58._12_2_;
                  sVar95 = auVar58._14_2_;
                  auVar133._12_2_ =
                       (ushort)(sVar94 < sVar67) * sVar67 | (ushort)(sVar94 >= sVar67) * sVar94;
                  sVar68 = auVar98._14_2_;
                  auVar133._14_2_ =
                       (ushort)(sVar95 < sVar68) * sVar68 | (ushort)(sVar95 >= sVar68) * sVar95;
                  auVar124._0_2_ = -(ushort)(sVar51 < sVar83);
                  auVar124._2_2_ = -(ushort)(sVar61 < sVar87);
                  auVar124._4_2_ = -(ushort)(sVar62 < sVar88);
                  auVar124._6_2_ = -(ushort)(sVar63 < sVar89);
                  auVar124._8_2_ = -(ushort)(sVar64 < sVar90);
                  auVar124._10_2_ = -(ushort)(sVar66 < sVar93);
                  auVar124._12_2_ = -(ushort)(sVar67 < sVar94);
                  auVar124._14_2_ = -(ushort)(sVar68 < sVar95);
                  auVar119 = auVar71 & auVar124 | ~auVar124 & auVar119;
                  auVar118 = auVar56 & auVar124 | ~auVar124 & auVar118;
                  auVar127 = paddsw(~auVar124 & auVar127 | auVar117 & auVar124,_DAT_008d0b80);
                  psVar2 = (short *)((long)*b + lVar42);
                  sVar51 = *psVar2;
                  sVar61 = psVar2[1];
                  sVar62 = psVar2[2];
                  sVar63 = psVar2[3];
                  sVar64 = psVar2[4];
                  sVar66 = psVar2[5];
                  sVar67 = psVar2[6];
                  sVar68 = psVar2[7];
                  uVar69 = (sVar51 < (short)uVar96) * uVar96 |
                           (ushort)(sVar51 >= (short)uVar96) * sVar51;
                  uVar75 = (sVar61 < (short)uVar101) * uVar101 |
                           (ushort)(sVar61 >= (short)uVar101) * sVar61;
                  uVar76 = (sVar62 < (short)uVar102) * uVar102 |
                           (ushort)(sVar62 >= (short)uVar102) * sVar62;
                  uVar77 = (sVar63 < (short)uVar103) * uVar103 |
                           (ushort)(sVar63 >= (short)uVar103) * sVar63;
                  uVar78 = (sVar64 < (short)uVar104) * uVar104 |
                           (ushort)(sVar64 >= (short)uVar104) * sVar64;
                  uVar80 = (sVar66 < (short)uVar106) * uVar106 |
                           (ushort)(sVar66 >= (short)uVar106) * sVar66;
                  uVar81 = (sVar67 < (short)uVar107) * uVar107 |
                           (ushort)(sVar67 >= (short)uVar107) * sVar67;
                  uVar82 = (sVar68 < (short)uVar108) * uVar108 |
                           (ushort)(sVar68 >= (short)uVar108) * sVar68;
                  auVar123._0_2_ =
                       ((short)uVar69 < (short)auVar133._0_2_) * auVar133._0_2_ |
                       ((short)uVar69 >= (short)auVar133._0_2_) * uVar69;
                  auVar123._2_2_ =
                       ((short)uVar75 < (short)auVar133._2_2_) * auVar133._2_2_ |
                       ((short)uVar75 >= (short)auVar133._2_2_) * uVar75;
                  auVar123._4_2_ =
                       ((short)uVar76 < (short)auVar133._4_2_) * auVar133._4_2_ |
                       ((short)uVar76 >= (short)auVar133._4_2_) * uVar76;
                  auVar123._6_2_ =
                       ((short)uVar77 < (short)auVar133._6_2_) * auVar133._6_2_ |
                       ((short)uVar77 >= (short)auVar133._6_2_) * uVar77;
                  auVar123._8_2_ =
                       ((short)uVar78 < (short)auVar133._8_2_) * auVar133._8_2_ |
                       ((short)uVar78 >= (short)auVar133._8_2_) * uVar78;
                  auVar123._10_2_ =
                       ((short)uVar80 < (short)auVar133._10_2_) * auVar133._10_2_ |
                       ((short)uVar80 >= (short)auVar133._10_2_) * uVar80;
                  auVar123._12_2_ =
                       ((short)uVar81 < (short)auVar133._12_2_) * auVar133._12_2_ |
                       ((short)uVar81 >= (short)auVar133._12_2_) * uVar81;
                  auVar123._14_2_ =
                       ((short)uVar82 < (short)auVar133._14_2_) * auVar133._14_2_ |
                       ((short)uVar82 >= (short)auVar133._14_2_) * uVar82;
                  auVar100._0_2_ = -(ushort)(uVar96 == auVar123._0_2_);
                  auVar100._2_2_ = -(ushort)(uVar101 == auVar123._2_2_);
                  auVar100._4_2_ = -(ushort)(uVar102 == auVar123._4_2_);
                  auVar100._6_2_ = -(ushort)(uVar103 == auVar123._6_2_);
                  auVar100._8_2_ = -(ushort)(uVar104 == auVar123._8_2_);
                  auVar100._10_2_ = -(ushort)(uVar106 == auVar123._10_2_);
                  auVar100._12_2_ = -(ushort)(uVar107 == auVar123._12_2_);
                  auVar100._14_2_ = -(ushort)(uVar108 == auVar123._14_2_);
                  auVar74._0_2_ = -(ushort)((short)auVar133._0_2_ < (short)uVar69);
                  auVar74._2_2_ = -(ushort)((short)auVar133._2_2_ < (short)uVar75);
                  auVar74._4_2_ = -(ushort)((short)auVar133._4_2_ < (short)uVar76);
                  auVar74._6_2_ = -(ushort)((short)auVar133._6_2_ < (short)uVar77);
                  auVar74._8_2_ = -(ushort)((short)auVar133._8_2_ < (short)uVar78);
                  auVar74._10_2_ = -(ushort)((short)auVar133._10_2_ < (short)uVar80);
                  auVar74._12_2_ = -(ushort)((short)auVar133._12_2_ < (short)uVar81);
                  auVar74._14_2_ = -(ushort)((short)auVar133._14_2_ < (short)uVar82);
                  auVar71 = *(undefined1 (*) [16])((long)*b_03 + lVar42) & auVar100 |
                            ~auVar100 &
                            (~auVar74 & auVar119 |
                            *(undefined1 (*) [16])((long)*b_00 + lVar42) & auVar74);
                  auVar56 = *(undefined1 (*) [16])((long)*b_04 + lVar42) & auVar100 |
                            ~auVar100 &
                            (~auVar74 & auVar118 |
                            *(undefined1 (*) [16])((long)*b_01 + lVar42) & auVar74);
                  auVar117 = auVar100 & *(undefined1 (*) [16])((long)*b_05 + lVar42) |
                             ~auVar100 &
                             (~auVar74 & auVar127 |
                             *(undefined1 (*) [16])((long)*b_02 + lVar42) & auVar74);
                  *(undefined1 (*) [16])((long)*ptr + lVar42) = auVar123;
                  *(undefined1 (*) [16])((long)*b_03 + lVar42) = auVar71;
                  *(undefined1 (*) [16])((long)*b_04 + lVar42) = auVar56;
                  *(undefined1 (*) [16])((long)*b_05 + lVar42) = auVar117;
                  uVar137 = ((short)auVar123._0_2_ < (short)uVar137) * auVar123._0_2_ |
                            ((short)auVar123._0_2_ >= (short)uVar137) * uVar137;
                  uVar138 = ((short)auVar123._2_2_ < (short)uVar138) * auVar123._2_2_ |
                            ((short)auVar123._2_2_ >= (short)uVar138) * uVar138;
                  uVar139 = ((short)auVar123._4_2_ < (short)uVar139) * auVar123._4_2_ |
                            ((short)auVar123._4_2_ >= (short)uVar139) * uVar139;
                  uVar140 = ((short)auVar123._6_2_ < (short)uVar140) * auVar123._6_2_ |
                            ((short)auVar123._6_2_ >= (short)uVar140) * uVar140;
                  uVar141 = ((short)auVar123._8_2_ < (short)uVar141) * auVar123._8_2_ |
                            ((short)auVar123._8_2_ >= (short)uVar141) * uVar141;
                  uVar142 = ((short)auVar123._10_2_ < (short)uVar142) * auVar123._10_2_ |
                            ((short)auVar123._10_2_ >= (short)uVar142) * uVar142;
                  uVar143 = ((short)auVar123._12_2_ < (short)uVar143) * auVar123._12_2_ |
                            ((short)auVar123._12_2_ >= (short)uVar143) * uVar143;
                  uVar144 = ((short)auVar123._14_2_ < (short)uVar144) * auVar123._14_2_ |
                            ((short)auVar123._14_2_ >= (short)uVar144) * uVar144;
                  uVar109 = ((short)uVar109 < (short)auVar123._0_2_) * auVar123._0_2_ |
                            ((short)uVar109 >= (short)auVar123._0_2_) * uVar109;
                  uVar110 = ((short)uVar110 < (short)auVar123._2_2_) * auVar123._2_2_ |
                            ((short)uVar110 >= (short)auVar123._2_2_) * uVar110;
                  uVar111 = ((short)uVar111 < (short)auVar123._4_2_) * auVar123._4_2_ |
                            ((short)uVar111 >= (short)auVar123._4_2_) * uVar111;
                  uVar112 = ((short)uVar112 < (short)auVar123._6_2_) * auVar123._6_2_ |
                            ((short)uVar112 >= (short)auVar123._6_2_) * uVar112;
                  uVar113 = ((short)uVar113 < (short)auVar123._8_2_) * auVar123._8_2_ |
                            ((short)uVar113 >= (short)auVar123._8_2_) * uVar113;
                  uVar114 = ((short)uVar114 < (short)auVar123._10_2_) * auVar123._10_2_ |
                            ((short)uVar114 >= (short)auVar123._10_2_) * uVar114;
                  uVar115 = ((short)uVar115 < (short)auVar123._12_2_) * auVar123._12_2_ |
                            ((short)uVar115 >= (short)auVar123._12_2_) * uVar115;
                  uVar116 = ((short)uVar116 < (short)auVar123._14_2_) * auVar123._14_2_ |
                            ((short)uVar116 >= (short)auVar123._14_2_) * uVar116;
                  sVar51 = auVar71._0_2_;
                  uVar109 = (ushort)((short)uVar109 < sVar51) * sVar51 |
                            ((short)uVar109 >= sVar51) * uVar109;
                  sVar51 = auVar71._2_2_;
                  uVar110 = (ushort)((short)uVar110 < sVar51) * sVar51 |
                            ((short)uVar110 >= sVar51) * uVar110;
                  sVar51 = auVar71._4_2_;
                  uVar111 = (ushort)((short)uVar111 < sVar51) * sVar51 |
                            ((short)uVar111 >= sVar51) * uVar111;
                  sVar51 = auVar71._6_2_;
                  uVar112 = (ushort)((short)uVar112 < sVar51) * sVar51 |
                            ((short)uVar112 >= sVar51) * uVar112;
                  sVar51 = auVar71._8_2_;
                  uVar113 = (ushort)((short)uVar113 < sVar51) * sVar51 |
                            ((short)uVar113 >= sVar51) * uVar113;
                  sVar51 = auVar71._10_2_;
                  uVar114 = (ushort)((short)uVar114 < sVar51) * sVar51 |
                            ((short)uVar114 >= sVar51) * uVar114;
                  sVar51 = auVar71._12_2_;
                  uVar115 = (ushort)((short)uVar115 < sVar51) * sVar51 |
                            ((short)uVar115 >= sVar51) * uVar115;
                  sVar51 = auVar71._14_2_;
                  uVar116 = (ushort)((short)uVar116 < sVar51) * sVar51 |
                            ((short)uVar116 >= sVar51) * uVar116;
                  sVar51 = auVar117._0_2_;
                  sVar61 = auVar56._0_2_;
                  uVar96 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61;
                  sVar51 = auVar117._2_2_;
                  sVar61 = auVar56._2_2_;
                  uVar101 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._4_2_;
                  sVar61 = auVar56._4_2_;
                  uVar102 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._6_2_;
                  sVar61 = auVar56._6_2_;
                  uVar103 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._8_2_;
                  sVar61 = auVar56._8_2_;
                  uVar104 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._10_2_;
                  sVar61 = auVar56._10_2_;
                  uVar106 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._12_2_;
                  sVar61 = auVar56._12_2_;
                  sVar62 = auVar56._14_2_;
                  uVar107 = (ushort)(sVar61 < sVar51) * sVar51 | (ushort)(sVar61 >= sVar51) * sVar61
                  ;
                  sVar51 = auVar117._14_2_;
                  uVar108 = (ushort)(sVar62 < sVar51) * sVar51 | (ushort)(sVar62 >= sVar51) * sVar62
                  ;
                  uVar109 = ((short)uVar96 < (short)uVar109) * uVar109 |
                            ((short)uVar96 >= (short)uVar109) * uVar96;
                  uVar110 = ((short)uVar101 < (short)uVar110) * uVar110 |
                            ((short)uVar101 >= (short)uVar110) * uVar101;
                  uVar111 = ((short)uVar102 < (short)uVar111) * uVar111 |
                            ((short)uVar102 >= (short)uVar111) * uVar102;
                  uVar112 = ((short)uVar103 < (short)uVar112) * uVar112 |
                            ((short)uVar103 >= (short)uVar112) * uVar103;
                  uVar113 = ((short)uVar104 < (short)uVar113) * uVar113 |
                            ((short)uVar104 >= (short)uVar113) * uVar104;
                  uVar114 = ((short)uVar106 < (short)uVar114) * uVar114 |
                            ((short)uVar106 >= (short)uVar114) * uVar106;
                  uVar115 = ((short)uVar107 < (short)uVar115) * uVar115 |
                            ((short)uVar107 >= (short)uVar115) * uVar107;
                  uVar116 = ((short)uVar108 < (short)uVar116) * uVar116 |
                            ((short)uVar108 >= (short)uVar116) * uVar108;
                  lVar42 = lVar42 + 0x10;
                } while (lVar34 != lVar42);
                uVar97 = ptr[uVar38][0];
                uVar105 = ptr[uVar38][1];
                uVar84 = b_03[uVar38][0];
                uVar91 = b_03[uVar38][1];
                uVar70 = b_04[uVar38][0];
                uVar79 = b_04[uVar38][1];
                uVar55 = b_05[uVar38][0];
                uVar65 = b_05[uVar38][1];
                iVar44 = iVar41;
                if (iVar28 < 7) {
                  do {
                    uVar105 = uVar105 << 0x10 | uVar97 >> 0x30;
                    uVar91 = uVar91 << 0x10 | uVar84 >> 0x30;
                    uVar79 = uVar79 << 0x10 | uVar70 >> 0x30;
                    uVar65 = uVar65 << 0x10 | uVar55 >> 0x30;
                    iVar44 = iVar44 + -1;
                    uVar97 = uVar97 << 0x10;
                    uVar84 = uVar84 << 0x10;
                    uVar70 = uVar70 << 0x10;
                    uVar55 = uVar55 << 0x10;
                  } while (iVar44 != 0);
                }
                *(int *)(*((ppVar33->field_4).trace)->trace_del_table + uVar46 * 4) =
                     (int)(short)(uVar105 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 8) +
                        uVar46 * 4) = (int)(short)(uVar91 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x10) +
                        uVar46 * 4) = (int)(short)(uVar79 >> 0x30);
                *(int *)(*(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x18) +
                        uVar46 * 4) = (int)(short)(uVar65 >> 0x30);
                uVar46 = uVar92;
              } while (uVar92 != uVar36);
              uVar36 = (ulong)(uVar49 * 4);
              lVar34 = uVar50 * 8;
              lVar42 = (ulong)(uVar49 * 4) * 3;
              lVar43 = uVar50 * 0x10;
              lVar47 = (ulong)(uVar49 * 4) * 5;
              lVar10 = uVar50 * 0x18;
              lVar11 = uVar50 * 0x1c;
              uVar50 = 0;
              do {
                psVar3 = (short *)((long)*ptr + uVar50 * 4);
                sVar51 = psVar3[1];
                sVar61 = psVar3[2];
                sVar62 = psVar3[3];
                sVar63 = psVar3[4];
                sVar64 = psVar3[5];
                sVar66 = psVar3[6];
                sVar67 = psVar3[7];
                psVar2 = (short *)((long)*b_03 + uVar50 * 4);
                sVar68 = *psVar2;
                sVar83 = psVar2[1];
                sVar87 = psVar2[2];
                sVar88 = psVar2[3];
                sVar89 = psVar2[4];
                sVar90 = psVar2[5];
                sVar93 = psVar2[6];
                sVar94 = psVar2[7];
                psVar2 = (short *)((long)*b_04 + uVar50 * 4);
                sVar95 = *psVar2;
                sVar12 = psVar2[1];
                sVar13 = psVar2[2];
                sVar14 = psVar2[3];
                sVar15 = psVar2[4];
                sVar16 = psVar2[5];
                sVar17 = psVar2[6];
                sVar18 = psVar2[7];
                psVar2 = (short *)((long)*b_05 + uVar50 * 4);
                sVar19 = *psVar2;
                sVar20 = psVar2[1];
                sVar21 = psVar2[2];
                sVar22 = psVar2[3];
                sVar23 = psVar2[4];
                sVar24 = psVar2[5];
                sVar25 = psVar2[6];
                sVar26 = psVar2[7];
                lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x20);
                *(int *)(lVar48 + uVar50) = (int)*psVar3;
                lVar48 = lVar48 + uVar50;
                *(int *)(uVar36 + lVar48) = (int)sVar51;
                *(int *)(lVar34 + lVar48) = (int)sVar61;
                *(int *)(lVar42 + lVar48) = (int)sVar62;
                *(int *)(lVar43 + lVar48) = (int)sVar63;
                *(int *)(lVar47 + lVar48) = (int)sVar64;
                *(int *)(lVar10 + lVar48) = (int)sVar66;
                *(int *)(lVar11 + lVar48) = (int)sVar67;
                lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x28);
                *(int *)(lVar48 + uVar50) = (int)sVar68;
                lVar48 = lVar48 + uVar50;
                *(int *)(uVar36 + lVar48) = (int)sVar83;
                *(int *)(lVar34 + lVar48) = (int)sVar87;
                *(int *)(lVar42 + lVar48) = (int)sVar88;
                *(int *)(lVar43 + lVar48) = (int)sVar89;
                *(int *)(lVar47 + lVar48) = (int)sVar90;
                *(int *)(lVar10 + lVar48) = (int)sVar93;
                *(int *)(lVar11 + lVar48) = (int)sVar94;
                lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x30);
                *(int *)(lVar48 + uVar50) = (int)sVar95;
                lVar48 = lVar48 + uVar50;
                *(int *)(uVar36 + lVar48) = (int)sVar12;
                *(int *)(lVar34 + lVar48) = (int)sVar13;
                *(int *)(lVar42 + lVar48) = (int)sVar14;
                *(int *)(lVar43 + lVar48) = (int)sVar15;
                *(int *)(lVar47 + lVar48) = (int)sVar16;
                *(int *)(lVar10 + lVar48) = (int)sVar17;
                *(int *)(lVar11 + lVar48) = (int)sVar18;
                lVar48 = *(long *)((long)((ppVar33->field_4).trace)->trace_del_table + 0x38);
                *(int *)(lVar48 + uVar50) = (int)sVar19;
                lVar48 = lVar48 + uVar50;
                *(int *)(uVar36 + lVar48) = (int)sVar20;
                *(int *)(lVar34 + lVar48) = (int)sVar21;
                *(int *)(lVar42 + lVar48) = (int)sVar22;
                *(int *)(lVar43 + lVar48) = (int)sVar23;
                *(int *)(lVar47 + lVar48) = (int)sVar24;
                *(int *)(lVar10 + lVar48) = (int)sVar25;
                *(int *)(lVar11 + lVar48) = (int)sVar26;
                uVar50 = uVar50 + 4;
              } while ((uVar49 + (uVar49 == 0)) * 4 != uVar50);
              uVar50 = ptr[uVar38][0];
              uVar36 = ptr[uVar38][1];
              uVar46 = b_03[uVar38][0];
              uVar92 = b_03[uVar38][1];
              uVar97 = b_04[uVar38][0];
              uVar105 = b_04[uVar38][1];
              uVar84 = b_05[uVar38][0];
              uVar91 = b_05[uVar38][1];
              if (iVar28 < 7) {
                iVar41 = 1;
                if (1 < iVar30) {
                  iVar41 = iVar30;
                }
                do {
                  uVar36 = uVar36 << 0x10 | uVar50 >> 0x30;
                  uVar92 = uVar92 << 0x10 | uVar46 >> 0x30;
                  uVar105 = uVar105 << 0x10 | uVar97 >> 0x30;
                  uVar91 = uVar91 << 0x10 | uVar84 >> 0x30;
                  iVar41 = iVar41 + -1;
                  uVar50 = uVar50 << 0x10;
                  uVar46 = uVar46 << 0x10;
                  uVar97 = uVar97 << 0x10;
                  uVar84 = uVar84 << 0x10;
                } while (iVar41 != 0);
              }
              auVar57._0_2_ = -(ushort)((short)uVar137 < (short)local_138);
              auVar57._2_2_ = -(ushort)((short)uVar138 < (short)uStack_136);
              auVar57._4_2_ = -(ushort)((short)uVar139 < (short)local_138);
              auVar57._6_2_ = -(ushort)((short)uVar140 < (short)uStack_136);
              auVar57._8_2_ = -(ushort)((short)uVar141 < (short)local_138);
              auVar57._10_2_ = -(ushort)((short)uVar142 < (short)uStack_136);
              auVar57._12_2_ = -(ushort)((short)uVar143 < (short)local_138);
              auVar57._14_2_ = -(ushort)((short)uVar144 < (short)uStack_136);
              auVar59._0_2_ = -(ushort)((short)local_98 < (short)uVar109);
              auVar59._2_2_ = -(ushort)((short)uStack_96 < (short)uVar110);
              auVar59._4_2_ = -(ushort)((short)local_98 < (short)uVar111);
              auVar59._6_2_ = -(ushort)((short)uStack_96 < (short)uVar112);
              auVar59._8_2_ = -(ushort)((short)local_98 < (short)uVar113);
              auVar59._10_2_ = -(ushort)((short)uStack_96 < (short)uVar114);
              auVar59._12_2_ = -(ushort)((short)local_98 < (short)uVar115);
              auVar59._14_2_ = -(ushort)((short)uStack_96 < (short)uVar116);
              auVar59 = auVar59 | auVar57;
              if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar59[0xf]) {
                sVar51 = (short)(uVar36 >> 0x30);
                sVar61 = (short)(uVar92 >> 0x30);
                sVar62 = (short)(uVar105 >> 0x30);
                sVar63 = (short)(uVar91 >> 0x30);
              }
              else {
                *(byte *)&ppVar33->flag = (byte)ppVar33->flag | 0x40;
                sVar51 = 0;
                sVar61 = 0;
                sVar62 = 0;
                sVar63 = 0;
                iVar29 = 0;
                iVar37 = 0;
              }
              ppVar33->score = (int)sVar51;
              ppVar33->end_query = iVar37;
              ppVar33->end_ref = iVar29;
              *(int *)(ppVar33->field_4).extra = (int)sVar61;
              ((ppVar33->field_4).stats)->similar = (int)sVar62;
              ((ppVar33->field_4).stats)->length = (int)sVar63;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar33;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}